

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

Vec_Int_t * Sbc_ManWlcNodes2(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGiaLits)

{
  uint *puVar1;
  int *__base;
  int iVar2;
  int iVar3;
  uint uVar4;
  int i;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar8;
  char *pcVar9;
  ulong uVar10;
  word *pTruth;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  size_t __nmemb;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntStartFull(p->nObjs);
  for (iVar12 = 0; iVar12 < vGiaLits->nSize; iVar12 = iVar12 + 1) {
    iVar2 = Vec_IntEntry(vGiaLits,iVar12);
    if (iVar2 != -1) {
      iVar3 = Abc_Lit2Var(iVar2);
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_Var2Lit(iVar12,iVar2);
      Vec_IntWriteEntry(p_01,iVar3,iVar2);
    }
  }
  uVar13 = 1;
  do {
    if (pNtk->iObj <= (int)uVar13) {
      Vec_IntFree(p_01);
      __base = p_00->pArray;
      __nmemb = (size_t)p_00->nSize;
      qsort(__base,__nmemb,4,Vec_IntSortCompare1);
      if ((long)__nmemb < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      pWVar8 = Wlc_NtkObj(pNtk,__base[__nmemb - 1]);
      iVar12 = Vec_IntEntry(&pNtk->vCopies,(int)(((long)pWVar8 - (long)pNtk->pObjs) / 0x18));
      uVar7 = pWVar8->End - pWVar8->Beg;
      uVar13 = -uVar7;
      if (0 < (int)uVar7) {
        uVar13 = uVar7;
      }
      uVar10 = ((long)pWVar8 - (long)pNtk->pObjs) / 0x18;
      pcVar9 = Wlc_ObjName(pNtk,(int)uVar10);
      printf("Considering object %d (%s):\n",uVar10 & 0xffffffff,pcVar9);
      uVar7 = 0;
      while( true ) {
        if (uVar13 < uVar7) {
          return p_00;
        }
        uVar4 = Vec_IntEntry(&pNtk->vBits,iVar12 + uVar7);
        uVar5 = Vec_IntFind(vGiaLits,uVar4);
        if ((int)uVar4 < 0) break;
        uVar6 = Vec_IntFind(vGiaLits,uVar4 ^ 1);
        printf("Matching bit %d with output %d / %d.\n",(ulong)uVar7,(ulong)uVar5,(ulong)uVar6);
        iVar2 = Abc_Lit2Var(uVar4);
        pTruth = Wlc_ObjSim(p,iVar2);
        Extra_PrintHex(_stdout,(uint *)pTruth,6);
        putchar(10);
        uVar7 = uVar7 + 1;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    pWVar8 = Wlc_NtkObj(pNtk,uVar13);
    iVar12 = Vec_IntEntry(&pNtk->vCopies,uVar13);
    uVar4 = pWVar8->End - pWVar8->Beg;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    for (uVar4 = 0; uVar4 <= uVar7; uVar4 = uVar4 + 1) {
      iVar2 = Vec_IntEntry(&pNtk->vBits,iVar12 + uVar4);
      iVar3 = Abc_Lit2Var(iVar2);
      iVar3 = Vec_IntEntry(p_01,iVar3);
      if (iVar3 != -1) {
        i = Abc_Lit2Var(iVar2);
        Vec_IntWriteEntry(p_01,i,-1);
        iVar2 = Abc_LitIsCompl(iVar2);
        iVar2 = Abc_LitNotCond(iVar3,iVar2);
        uVar5 = Abc_Lit2Var(iVar2);
        uVar6 = Abc_LitIsCompl(iVar2);
        pcVar9 = Wlc_ObjName(pNtk,(int)(((long)pWVar8 - (long)pNtk->pObjs) / 0x18));
        printf("Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n",(ulong)uVar5,
               (ulong)uVar6,(ulong)uVar13,pcVar9,(ulong)uVar4,uVar7 + 1);
        uVar10 = (ulong)(uint)p_00->nSize;
        if (p_00->nSize < 1) {
          uVar10 = 0;
        }
        uVar11 = 0;
        do {
          if (uVar10 == uVar11) {
            Vec_IntPush(p_00,uVar13);
            break;
          }
          puVar1 = (uint *)(p_00->pArray + uVar11);
          uVar11 = uVar11 + 1;
        } while (*puVar1 != uVar13);
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Sbc_ManWlcNodes2( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGiaLits )
{
    Wlc_Obj_t * pObj;  int i, k, iGiaLit, iFirst, nBits;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vGiaLits, iGiaLit, i )
        if ( iGiaLit != -1 )
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iGiaLit), Abc_Var2Lit(i, Abc_LitIsCompl(iGiaLit)) );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        for ( k = 0; k < nBits; k++ )
        {
            int iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            int iLitOut = Vec_IntEntry( vMap, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLitGia), -1 );
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n", Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut), i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits );
            Vec_IntPushUnique( vRes, i );
        }
    }
    Vec_IntFree( vMap );
    Vec_IntSort( vRes, 0 );
    // consider the last one
    pObj   = Wlc_NtkObj( pNtk, Vec_IntEntryLast(vRes) );
    iFirst = Vec_IntEntry( &pNtk->vCopies, Wlc_ObjId(pNtk, pObj) );
    nBits  = Wlc_ObjRange(pObj);
    printf( "Considering object %d (%s):\n", Wlc_ObjId(pNtk, pObj), Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLitGia  = Vec_IntEntry( &pNtk->vBits, iFirst + k );
        int iLitOutP = Vec_IntFind( vGiaLits, iLitGia );
        int iLitOutN = Vec_IntFind( vGiaLits, Abc_LitNot(iLitGia) );
        printf( "Matching bit %d with output %d / %d.\n", k, iLitOutP, iLitOutN );
        // print simulation signature
        {
            word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
            Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
        }
    }
    return vRes;
}